

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O2

bool __thiscall FIX::TimeRange::isInSameRange(TimeRange *this,DateTime *time1,DateTime *time2)

{
  bool bVar1;
  DateTime DStack_70;
  DateTime DStack_58;
  DateTime DStack_40;
  DateTime DStack_28;
  
  if (-1 < (this->m_startDay & this->m_endDay)) {
    DStack_28._vptr_DateTime = (_func_int **)&PTR__DateTime_001fc7c0;
    DStack_28.m_date = (this->m_startTime).super_DateTime.m_date;
    DStack_28._12_4_ = *(undefined4 *)&(this->m_startTime).super_DateTime.field_0xc;
    DStack_28.m_time = (this->m_startTime).super_DateTime.m_time;
    DStack_40._vptr_DateTime = (_func_int **)&PTR__DateTime_001fc7c0;
    DStack_40.m_date = (this->m_endTime).super_DateTime.m_date;
    DStack_40._12_4_ = *(undefined4 *)&(this->m_endTime).super_DateTime.field_0xc;
    DStack_40.m_time = (this->m_endTime).super_DateTime.m_time;
    DStack_58._vptr_DateTime = (_func_int **)&PTR__DateTime_001fc7c0;
    DStack_58.m_date = time1->m_date;
    DStack_58._12_4_ = *(undefined4 *)&time1->field_0xc;
    DStack_58.m_time = time1->m_time;
    DStack_70._vptr_DateTime = (_func_int **)&PTR__DateTime_001fc7c0;
    DStack_70.m_date = time2->m_date;
    DStack_70._12_4_ = *(undefined4 *)&time2->field_0xc;
    DStack_70.m_time = time2->m_time;
    bVar1 = isInSameRange(&DStack_28,&DStack_40,this->m_startDay,this->m_endDay,&DStack_58,
                          &DStack_70);
    return bVar1;
  }
  bVar1 = isInSameRange(&this->m_startTime,&this->m_endTime,time1,time2);
  return bVar1;
}

Assistant:

bool isInSameRange(const DateTime &time1, const DateTime &time2) {
    if (m_startDay < 0 && m_endDay < 0) {
      return isInSameRange(m_startTime, m_endTime, time1, time2);
    } else {
      return isInSameRange(m_startTime, m_endTime, m_startDay, m_endDay, time1, time2);
    }
  }